

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syncprod.cc
# Opt level: O2

outgoing_edges_iterator_t * __thiscall
tchecker::syncprod::outgoing_edges_iterator_t::operator++(outgoing_edges_iterator_t *this)

{
  bool bVar1;
  
  bVar1 = at_end(this);
  if (!bVar1) {
    vloc_edges_iterator_t::operator++(&this->_it);
    advance_while_not_enabled(this);
    return this;
  }
  __assert_fail("!at_end()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/syncprod/syncprod.cc"
                ,0xa8,
                "tchecker::syncprod::outgoing_edges_iterator_t &tchecker::syncprod::outgoing_edges_iterator_t::operator++()"
               );
}

Assistant:

tchecker::syncprod::outgoing_edges_iterator_t & outgoing_edges_iterator_t::operator++()
{
  assert(!at_end());
  ++_it;
  advance_while_not_enabled();
  return *this;
}